

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *__s;
  int in_EDX;
  int *in_RDI;
  int i;
  int old_channels_count;
  ImDrawChannel *in_stack_ffffffffffffffb8;
  int iVar2;
  ImVector<ImDrawCmd> *in_stack_ffffffffffffffc0;
  uint3 in_stack_ffffffffffffffd0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c;
  
  uVar3 = (uint)in_stack_ffffffffffffffd0;
  if ((*in_RDI == 0) && (uVar3 = (uint)in_stack_ffffffffffffffd0, in_RDI[1] < 2)) {
    uVar3 = CONCAT13(1,in_stack_ffffffffffffffd0);
  }
  if ((char)(uVar3 >> 0x18) == '\0') {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x5de,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = in_RDI[2];
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (iVar1 < in_EDX) {
    ImVector<ImDrawChannel>::reserve
              ((ImVector<ImDrawChannel> *)CONCAT44(in_stack_ffffffffffffffd4,uVar3),
               (int)((ulong)in_RDI >> 0x20));
    ImVector<ImDrawChannel>::resize((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,iVar2);
  }
  in_RDI[1] = in_EDX;
  __s = ImVector<ImDrawChannel>::operator[]
                  ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,iVar2);
  memset(__s,0,0x20);
  for (local_1c = 1; local_1c < in_EDX; local_1c = local_1c + 1) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (local_1c < iVar1) {
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,iVar2);
      ImVector<ImDrawCmd>::resize(in_stack_ffffffffffffffc0,iVar2);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,iVar2);
      ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)in_stack_ffffffffffffffc0,iVar2);
    }
    else {
      in_stack_ffffffffffffffb8 =
           ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,iVar2);
      in_stack_ffffffffffffffc0 = (ImVector<ImDrawCmd> *)operator_new(0x20);
      *(undefined1 (*) [32])in_stack_ffffffffffffffc0 = ZEXT1632(ZEXT816(0) << 0x40);
      ImDrawChannel::ImDrawChannel((ImDrawChannel *)CONCAT44(in_stack_ffffffffffffffd4,uVar3));
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}